

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithDescriptor<false>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<int> **pdescriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Flags FVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  Var aValue;
  RecyclableObject *function;
  Flags FVar10;
  uint propertyId;
  DictionaryPropertyDescriptor<int> *pDVar11;
  Var pvVar12;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_60;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord_local;
  Var local_48;
  DictionaryTypeHandlerBase<int> *local_40;
  uint local_34;
  
  local_58 = propertyRecord;
  propertyRecord_local._4_4_ = flags;
  local_40 = this;
  if ((pdescriptor == (DictionaryPropertyDescriptor<int> **)0x0) ||
     (pDVar11 = *pdescriptor, pDVar11 == (DictionaryPropertyDescriptor<int> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar4) goto LAB_00c33ac8;
    *puVar9 = 0;
    pDVar11 = *pdescriptor;
  }
  local_34 = propertyRecord->pid;
  bVar4 = instance == (DynamicObject *)0x0;
  local_48 = value;
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar5) goto LAB_00c33ac8;
    *puVar9 = 0;
  }
  if ((pDVar11->Attributes & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar5) goto LAB_00c33ac8;
    *puVar9 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar5) goto LAB_00c33ac8;
    *puVar9 = 0;
  }
  pRVar2 = (local_40->singletonInstance).ptr;
  if (pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar4 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x2ed,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar4) goto LAB_00c33ac8;
      *puVar9 = 0;
      bVar4 = false;
    }
  }
  iVar7 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDVar11);
  pvVar12 = local_48;
  if (iVar7 == -1) {
    iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar11);
    propertyId = local_34;
    pvVar12 = local_48;
    if (iVar7 == -1) goto LAB_00c33a23;
    iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar11);
    aValue = DynamicObject::GetSlot(instance,iVar7);
    function = VarTo<Js::RecyclableObject>(aValue);
    JavascriptOperators::CallSetter(function,instance,pvVar12,(ScriptContext *)0x0);
    bVar4 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)(local_40->propertyMap).ptr,&local_58,pdescriptor);
    if (!bVar4) {
      *pdescriptor = (DictionaryPropertyDescriptor<int> *)0x0;
      goto LAB_00c33a23;
    }
    pDVar11 = *pdescriptor;
    iVar7 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDVar11);
    if (iVar7 == -1) {
      iVar7 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar11);
      if (iVar7 == -1) goto LAB_00c33a23;
      DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar11);
    }
  }
  else {
    if ((pDVar11->flags & IsInitialized) == None) {
      if ((((propertyRecord_local._4_4_ & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (pDVar11->flags = pDVar11->flags | IsInitialized, bVar4)) &&
         ((propertyRecord_local._4_4_ &
          (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < local_34)) {
        if (local_48 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x305,"(value != nullptr)","value != nullptr");
          if (!bVar4) goto LAB_00c33ac8;
          *puVar9 = 0;
        }
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar8 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar4) {
LAB_00c33ac8:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        bVar4 = VarIs<Js::JavascriptFunction>(pvVar12);
        if (bVar4) {
          bVar4 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00c33aa5:
          FVar10 = pDVar11->flags & ~IsFixed;
          if (bVar4 == false) goto LAB_00c33abb;
          FVar6 = IsFixed;
        }
        else {
          bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
          if (bVar4) {
            bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,pvVar12);
            goto LAB_00c33aa5;
          }
          FVar10 = pDVar11->flags & ~IsFixed;
LAB_00c33abb:
          FVar6 = None;
        }
        pDVar11->flags = FVar10 | FVar6;
      }
    }
    else {
      InvalidateFixedField<int>(local_40,instance,local_34,pDVar11);
    }
    pvVar12 = local_48;
    DynamicTypeHandler::SetSlotUnchecked(instance,iVar7,local_48);
    propertyId = local_34;
  }
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00c33a23:
  bVar4 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId);
  if ((bVar4) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_60,
               &((((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                javascriptLibrary)->typesWithNoSpecialPropertyProtoChain);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60.ptr);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pvVar12,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }